

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

SQClosure * __thiscall SQClosure::Clone(SQClosure *this)

{
  SQFunctionProto *func;
  SQClosure *pSVar1;
  long local_30;
  SQInteger _n__1;
  SQInteger _n_;
  SQClosure *ret;
  SQFunctionProto *f;
  SQClosure *this_local;
  
  func = this->_function;
  pSVar1 = Create((this->super_SQCollectable)._sharedstate,func,this->_root);
  pSVar1->_env = this->_env;
  if (pSVar1->_env != (SQWeakRef *)0x0) {
    (pSVar1->_env->super_SQRefCounted)._uiRef = (pSVar1->_env->super_SQRefCounted)._uiRef + 1;
  }
  for (_n__1 = 0; _n__1 < func->_noutervalues; _n__1 = _n__1 + 1) {
    ::SQObjectPtr::operator=(pSVar1->_outervalues + _n__1,this->_outervalues + _n__1);
  }
  for (local_30 = 0; local_30 < func->_ndefaultparams; local_30 = local_30 + 1) {
    ::SQObjectPtr::operator=(pSVar1->_defaultparams + local_30,this->_defaultparams + local_30);
  }
  return pSVar1;
}

Assistant:

SQClosure *Clone()
    {
        SQFunctionProto *f = _function;
        SQClosure * ret = SQClosure::Create(_opt_ss(this),f,_root);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        _COPY_VECTOR(ret->_outervalues,_outervalues,f->_noutervalues);
        _COPY_VECTOR(ret->_defaultparams,_defaultparams,f->_ndefaultparams);
        return ret;
    }